

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.cpp
# Opt level: O0

void __thiscall
btConeTwistConstraint::getInfo2NonVirtual
          (btConeTwistConstraint *this,btConstraintInfo2 *info,btTransform *transA,
          btTransform *transB,btMatrix3x3 *invInertiaWorldA,btMatrix3x3 *invInertiaWorldB)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long lVar4;
  int iVar5;
  btMatrix3x3 *v2;
  btMatrix3x3 *v1;
  btScalar *pbVar6;
  btVector3 *pbVar7;
  btTransform *in_RCX;
  btTransform *in_RDX;
  float *in_RSI;
  btVector3 *in_RDI;
  float fVar8;
  btScalar bVar9;
  btVector3 bVar10;
  btScalar k_2;
  btScalar *J2_1;
  btScalar *J1_1;
  btScalar k_1;
  btScalar fact;
  int srow1;
  btVector3 q;
  btVector3 p;
  btTransform trA;
  btScalar *J2;
  btScalar *J1;
  btVector3 ax1;
  int srow;
  int row;
  int j;
  btScalar k;
  btScalar linERP;
  btVector3 *angular2_1;
  btVector3 *angular1_1;
  btVector3 *angular0_1;
  btVector3 a2;
  btVector3 a1neg;
  btVector3 *angular2;
  btVector3 *angular1;
  btVector3 *angular0;
  btVector3 a1;
  btMatrix3x3 *in_stack_00000340;
  btMatrix3x3 *in_stack_00000348;
  btTransform *in_stack_00000350;
  btTransform *in_stack_00000358;
  btConeTwistConstraint *in_stack_00000360;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  btScalar *in_stack_fffffffffffffe28;
  btTransform *in_stack_fffffffffffffe30;
  float local_1ac;
  btVector3 *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  btTransform *in_stack_fffffffffffffe78;
  long lVar11;
  btScalar local_164 [2];
  btScalar local_15c [7];
  btScalar local_140 [2];
  btScalar local_138 [4];
  btVector3 local_128;
  btVector3 local_118;
  btTransform local_108;
  long local_c8;
  long local_c0;
  btVector3 local_b4;
  int local_a4;
  undefined4 local_a0;
  int local_9c;
  float local_98;
  float local_94;
  long local_90;
  long local_88;
  undefined8 local_80;
  btVector3 local_78;
  btScalar local_68 [4];
  long local_58;
  long local_50;
  undefined8 local_48;
  btVector3 local_40 [2];
  btTransform *local_20;
  btTransform *local_18;
  float *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  calcAngleInfo2(in_stack_00000360,in_stack_00000358,in_stack_00000350,in_stack_00000348,
                 in_stack_00000340);
  **(undefined4 **)(local_10 + 2) = 0x3f800000;
  *(undefined4 *)(*(long *)(local_10 + 2) + 4 + (long)(int)local_10[10] * 4) = 0x3f800000;
  *(undefined4 *)(*(long *)(local_10 + 2) + 8 + (long)((int)local_10[10] * 2) * 4) = 0x3f800000;
  v2 = btTransform::getBasis(local_18);
  btTransform::getOrigin((btTransform *)(in_RDI[0x14].m_floats + 1));
  local_40[0] = ::operator*(&in_stack_fffffffffffffe30->m_basis,
                            (btVector3 *)in_stack_fffffffffffffe28);
  local_48 = *(undefined8 *)(local_10 + 4);
  local_50 = *(long *)(local_10 + 4) + (long)(int)local_10[10] * 4;
  local_58 = *(long *)(local_10 + 4) + (long)((int)local_10[10] * 2) * 4;
  local_68 = (btScalar  [4])
             operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  btVector3::getSkewSymmetricMatrix
            ((btVector3 *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),in_RDI,
             in_stack_fffffffffffffe60,v2->m_el);
  **(undefined4 **)(local_10 + 6) = 0xbf800000;
  *(undefined4 *)(*(long *)(local_10 + 6) + 4 + (long)(int)local_10[10] * 4) = 0xbf800000;
  *(undefined4 *)(*(long *)(local_10 + 6) + 8 + (long)((int)local_10[10] * 2) * 4) = 0xbf800000;
  v1 = btTransform::getBasis(local_20);
  btTransform::getOrigin((btTransform *)(in_RDI[0x18].m_floats + 1));
  local_78 = ::operator*(&in_stack_fffffffffffffe30->m_basis,(btVector3 *)in_stack_fffffffffffffe28)
  ;
  local_80 = *(undefined8 *)(local_10 + 8);
  local_88 = *(long *)(local_10 + 8) + (long)(int)local_10[10] * 4;
  local_90 = *(long *)(local_10 + 8) + (long)((int)local_10[10] << 1) * 4;
  btVector3::getSkewSymmetricMatrix
            ((btVector3 *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),in_RDI,
             v1->m_el,v2->m_el);
  if (((uint)in_RDI[0x26].m_floats[2] & 2) == 0) {
    local_1ac = local_10[1];
  }
  else {
    local_1ac = in_RDI[0x27].m_floats[0];
  }
  local_94 = local_1ac;
  local_98 = *local_10 * local_1ac;
  for (local_9c = 0; fVar8 = local_98, local_9c < 3; local_9c = local_9c + 1) {
    pbVar6 = btVector3::operator_cast_to_float_(&local_78);
    fVar1 = pbVar6[local_9c];
    pbVar7 = btTransform::getOrigin(local_20);
    pbVar6 = btVector3::operator_cast_to_float_(pbVar7);
    fVar2 = pbVar6[local_9c];
    pbVar6 = btVector3::operator_cast_to_float_(local_40);
    fVar3 = pbVar6[local_9c];
    pbVar7 = btTransform::getOrigin(local_18);
    pbVar6 = btVector3::operator_cast_to_float_(pbVar7);
    *(float *)(*(long *)(local_10 + 0xc) + (long)(local_9c * (int)local_10[10]) * 4) =
         fVar8 * (((fVar1 + fVar2) - fVar3) - pbVar6[local_9c]);
    *(undefined4 *)(*(long *)(local_10 + 0x10) + (long)(local_9c * (int)local_10[10]) * 4) =
         0xff7fffff;
    *(undefined4 *)(*(long *)(local_10 + 0x12) + (long)(local_9c * (int)local_10[10]) * 4) =
         0x7f7fffff;
    if (((uint)in_RDI[0x26].m_floats[2] & 1) != 0) {
      *(btScalar *)(*(long *)(local_10 + 0xe) + (long)(local_9c * (int)local_10[10]) * 4) =
           in_RDI[0x26].m_floats[3];
    }
  }
  local_a0 = 3;
  local_a4 = (int)local_10[10] * 3;
  btVector3::btVector3(&local_b4);
  if ((*(byte *)((long)in_RDI[0x22].m_floats + 6) & 1) != 0) {
    local_c0 = *(long *)(local_10 + 4);
    local_c8 = *(long *)(local_10 + 8);
    if ((in_RDI[0x1e].m_floats[0] <= in_RDI[0x1d].m_floats[1]) ||
       (in_RDI[0x1e].m_floats[0] <= in_RDI[0x1d].m_floats[2])) {
      in_stack_fffffffffffffe28 = in_RDI[0x1c].m_floats + 3;
      ::operator*((btVector3 *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      bVar10 = ::operator*((btVector3 *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      local_140 = bVar10.m_floats._0_8_;
      local_b4.m_floats[0] = local_140[0];
      local_b4.m_floats[1] = local_140[1];
      local_138._0_8_ = bVar10.m_floats._8_8_;
      local_b4.m_floats[2] = local_138[0];
      local_b4.m_floats[3] = local_138[1];
      pbVar6 = btVector3::operator_cast_to_float_(&local_b4);
      *(btScalar *)(local_c0 + (long)local_a4 * 4) = *pbVar6;
      pbVar6 = btVector3::operator_cast_to_float_(&local_b4);
      *(btScalar *)(local_c0 + (long)(local_a4 + 1) * 4) = pbVar6[1];
      pbVar6 = btVector3::operator_cast_to_float_(&local_b4);
      *(btScalar *)(local_c0 + (long)(local_a4 + 2) * 4) = pbVar6[2];
      pbVar6 = btVector3::operator_cast_to_float_(&local_b4);
      *(float *)(local_c8 + (long)local_a4 * 4) = -*pbVar6;
      pbVar6 = btVector3::operator_cast_to_float_(&local_b4);
      *(float *)(local_c8 + (long)(local_a4 + 1) * 4) = -pbVar6[1];
      pbVar6 = btVector3::operator_cast_to_float_(&local_b4);
      *(float *)(local_c8 + (long)(local_a4 + 2) * 4) = -pbVar6[2];
      *(float *)(*(long *)(local_10 + 0xc) + (long)local_a4 * 4) =
           *local_10 * in_RDI[0x1c].m_floats[2] * in_RDI[0x21].m_floats[0];
      if (((uint)in_RDI[0x26].m_floats[2] & 4) != 0) {
        *(btScalar *)(*(long *)(local_10 + 0xe) + (long)local_a4 * 4) = in_RDI[0x27].m_floats[1];
      }
      *(undefined4 *)(*(long *)(local_10 + 0x10) + (long)local_a4 * 4) = 0;
      if ((((uint)in_RDI[0x24].m_floats[0] & 1) == 0) || (in_RDI[0x25].m_floats[1] < 0.0)) {
        bVar9 = 3.4028235e+38;
      }
      else {
        bVar9 = in_RDI[0x25].m_floats[1];
      }
      *(btScalar *)(*(long *)(local_10 + 0x12) + (long)local_a4 * 4) = bVar9;
      local_a4 = (int)local_10[10] + local_a4;
    }
    else {
      in_stack_fffffffffffffe30 = &local_108;
      btTransform::operator*
                (in_stack_fffffffffffffe78,
                 (btTransform *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      btTransform::getBasis(in_stack_fffffffffffffe30);
      local_118 = btMatrix3x3::getColumn
                            (&in_stack_fffffffffffffe30->m_basis,
                             (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
      btTransform::getBasis(in_stack_fffffffffffffe30);
      local_128 = btMatrix3x3::getColumn
                            (&in_stack_fffffffffffffe30->m_basis,
                             (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
      iVar5 = local_a4 + (int)local_10[10];
      pbVar6 = btVector3::operator_cast_to_float_(&local_118);
      *(btScalar *)(local_c0 + (long)local_a4 * 4) = *pbVar6;
      pbVar6 = btVector3::operator_cast_to_float_(&local_118);
      *(btScalar *)(local_c0 + (long)(local_a4 + 1) * 4) = pbVar6[1];
      pbVar6 = btVector3::operator_cast_to_float_(&local_118);
      *(btScalar *)(local_c0 + (long)(local_a4 + 2) * 4) = pbVar6[2];
      pbVar6 = btVector3::operator_cast_to_float_(&local_128);
      *(btScalar *)(local_c0 + (long)iVar5 * 4) = *pbVar6;
      pbVar6 = btVector3::operator_cast_to_float_(&local_128);
      *(btScalar *)(local_c0 + (long)(iVar5 + 1) * 4) = pbVar6[1];
      pbVar6 = btVector3::operator_cast_to_float_(&local_128);
      *(btScalar *)(local_c0 + (long)(iVar5 + 2) * 4) = pbVar6[2];
      pbVar6 = btVector3::operator_cast_to_float_(&local_118);
      *(float *)(local_c8 + (long)local_a4 * 4) = -*pbVar6;
      pbVar6 = btVector3::operator_cast_to_float_(&local_118);
      *(float *)(local_c8 + (long)(local_a4 + 1) * 4) = -pbVar6[1];
      pbVar6 = btVector3::operator_cast_to_float_(&local_118);
      *(float *)(local_c8 + (long)(local_a4 + 2) * 4) = -pbVar6[2];
      pbVar6 = btVector3::operator_cast_to_float_(&local_128);
      *(float *)(local_c8 + (long)iVar5 * 4) = -*pbVar6;
      pbVar6 = btVector3::operator_cast_to_float_(&local_128);
      *(float *)(local_c8 + (long)(iVar5 + 1) * 4) = -pbVar6[1];
      pbVar6 = btVector3::operator_cast_to_float_(&local_128);
      *(float *)(local_c8 + (long)(iVar5 + 2) * 4) = -pbVar6[2];
      fVar8 = *local_10 * in_RDI[0x1c].m_floats[3];
      bVar9 = btVector3::dot((btVector3 *)(in_RDI[0x1e].m_floats + 1),&local_118);
      *(float *)(*(long *)(local_10 + 0xc) + (long)local_a4 * 4) = fVar8 * bVar9;
      bVar9 = btVector3::dot((btVector3 *)(in_RDI[0x1e].m_floats + 1),&local_128);
      *(float *)(*(long *)(local_10 + 0xc) + (long)iVar5 * 4) = fVar8 * bVar9;
      *(undefined4 *)(*(long *)(local_10 + 0x10) + (long)local_a4 * 4) = 0xff7fffff;
      *(undefined4 *)(*(long *)(local_10 + 0x12) + (long)local_a4 * 4) = 0x7f7fffff;
      *(undefined4 *)(*(long *)(local_10 + 0x10) + (long)iVar5 * 4) = 0xff7fffff;
      *(undefined4 *)(*(long *)(local_10 + 0x12) + (long)iVar5 * 4) = 0x7f7fffff;
      local_a4 = iVar5 + (int)local_10[10];
    }
  }
  if ((*(byte *)((long)in_RDI[0x22].m_floats + 5) & 1) != 0) {
    ::operator*((btVector3 *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    bVar10 = ::operator*((btVector3 *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    local_164 = bVar10.m_floats._0_8_;
    local_b4.m_floats[0] = local_164[0];
    local_b4.m_floats[1] = local_164[1];
    local_15c._0_8_ = bVar10.m_floats._8_8_;
    local_b4.m_floats[2] = local_15c[0];
    local_b4.m_floats[3] = local_15c[1];
    lVar4 = *(long *)(local_10 + 4);
    lVar11 = *(long *)(local_10 + 8);
    pbVar6 = btVector3::operator_cast_to_float_(&local_b4);
    *(btScalar *)(lVar4 + (long)local_a4 * 4) = *pbVar6;
    pbVar6 = btVector3::operator_cast_to_float_(&local_b4);
    *(btScalar *)(lVar4 + (long)(local_a4 + 1) * 4) = pbVar6[1];
    pbVar6 = btVector3::operator_cast_to_float_(&local_b4);
    *(btScalar *)(lVar4 + (long)(local_a4 + 2) * 4) = pbVar6[2];
    pbVar6 = btVector3::operator_cast_to_float_(&local_b4);
    *(float *)(lVar11 + (long)local_a4 * 4) = -*pbVar6;
    pbVar6 = btVector3::operator_cast_to_float_(&local_b4);
    *(float *)(lVar11 + (long)(local_a4 + 1) * 4) = -pbVar6[1];
    pbVar6 = btVector3::operator_cast_to_float_(&local_b4);
    *(float *)(lVar11 + (long)(local_a4 + 2) * 4) = -pbVar6[2];
    *(float *)(*(long *)(local_10 + 0xc) + (long)local_a4 * 4) =
         *local_10 * in_RDI[0x1c].m_floats[2] * in_RDI[0x21].m_floats[1];
    if (((uint)in_RDI[0x26].m_floats[2] & 4) != 0) {
      *(btScalar *)(*(long *)(local_10 + 0xe) + (long)local_a4 * 4) = in_RDI[0x27].m_floats[1];
    }
    if (in_RDI[0x1d].m_floats[3] <= 0.0) {
      *(undefined4 *)(*(long *)(local_10 + 0x10) + (long)local_a4 * 4) = 0xff7fffff;
      *(undefined4 *)(*(long *)(local_10 + 0x12) + (long)local_a4 * 4) = 0x7f7fffff;
    }
    else if (in_RDI[0x21].m_floats[1] <= 0.0) {
      *(undefined4 *)(*(long *)(local_10 + 0x10) + (long)local_a4 * 4) = 0xff7fffff;
      *(undefined4 *)(*(long *)(local_10 + 0x12) + (long)local_a4 * 4) = 0;
    }
    else {
      *(undefined4 *)(*(long *)(local_10 + 0x10) + (long)local_a4 * 4) = 0;
      *(undefined4 *)(*(long *)(local_10 + 0x12) + (long)local_a4 * 4) = 0x7f7fffff;
    }
  }
  return;
}

Assistant:

void btConeTwistConstraint::getInfo2NonVirtual (btConstraintInfo2* info,const btTransform& transA,const btTransform& transB,const btMatrix3x3& invInertiaWorldA,const btMatrix3x3& invInertiaWorldB)
{
	calcAngleInfo2(transA,transB,invInertiaWorldA,invInertiaWorldB);
	
	btAssert(!m_useSolveConstraintObsolete);
    // set jacobian
    info->m_J1linearAxis[0] = 1;
    info->m_J1linearAxis[info->rowskip+1] = 1;
    info->m_J1linearAxis[2*info->rowskip+2] = 1;
	btVector3 a1 = transA.getBasis() * m_rbAFrame.getOrigin();
	{
		btVector3* angular0 = (btVector3*)(info->m_J1angularAxis);
		btVector3* angular1 = (btVector3*)(info->m_J1angularAxis+info->rowskip);
		btVector3* angular2 = (btVector3*)(info->m_J1angularAxis+2*info->rowskip);
		btVector3 a1neg = -a1;
		a1neg.getSkewSymmetricMatrix(angular0,angular1,angular2);
	}
    info->m_J2linearAxis[0] = -1;
    info->m_J2linearAxis[info->rowskip+1] = -1;
    info->m_J2linearAxis[2*info->rowskip+2] = -1;
	btVector3 a2 = transB.getBasis() * m_rbBFrame.getOrigin();
	{
		btVector3* angular0 = (btVector3*)(info->m_J2angularAxis);
		btVector3* angular1 = (btVector3*)(info->m_J2angularAxis+info->rowskip);
		btVector3* angular2 = (btVector3*)(info->m_J2angularAxis+2*info->rowskip);
		a2.getSkewSymmetricMatrix(angular0,angular1,angular2);
	}
    // set right hand side
	btScalar linERP = (m_flags & BT_CONETWIST_FLAGS_LIN_ERP) ? m_linERP : info->erp;
    btScalar k = info->fps * linERP;
    int j;
	for (j=0; j<3; j++)
    {
        info->m_constraintError[j*info->rowskip] = k * (a2[j] + transB.getOrigin()[j] - a1[j] - transA.getOrigin()[j]);
		info->m_lowerLimit[j*info->rowskip] = -SIMD_INFINITY;
		info->m_upperLimit[j*info->rowskip] = SIMD_INFINITY;
		if(m_flags & BT_CONETWIST_FLAGS_LIN_CFM)
		{
			info->cfm[j*info->rowskip] = m_linCFM;
		}
    }
	int row = 3;
    int srow = row * info->rowskip;
	btVector3 ax1;
	// angular limits
	if(m_solveSwingLimit)
	{
		btScalar *J1 = info->m_J1angularAxis;
		btScalar *J2 = info->m_J2angularAxis;
		if((m_swingSpan1 < m_fixThresh) && (m_swingSpan2 < m_fixThresh))
		{
			btTransform trA = transA*m_rbAFrame;
			btVector3 p = trA.getBasis().getColumn(1);
			btVector3 q = trA.getBasis().getColumn(2);
			int srow1 = srow + info->rowskip;
			J1[srow+0] = p[0];
			J1[srow+1] = p[1];
			J1[srow+2] = p[2];
			J1[srow1+0] = q[0];
			J1[srow1+1] = q[1];
			J1[srow1+2] = q[2];
			J2[srow+0] = -p[0];
			J2[srow+1] = -p[1];
			J2[srow+2] = -p[2];
			J2[srow1+0] = -q[0];
			J2[srow1+1] = -q[1];
			J2[srow1+2] = -q[2];
			btScalar fact = info->fps * m_relaxationFactor;
			info->m_constraintError[srow] =   fact * m_swingAxis.dot(p);
			info->m_constraintError[srow1] =  fact * m_swingAxis.dot(q);
			info->m_lowerLimit[srow] = -SIMD_INFINITY;
			info->m_upperLimit[srow] = SIMD_INFINITY;
			info->m_lowerLimit[srow1] = -SIMD_INFINITY;
			info->m_upperLimit[srow1] = SIMD_INFINITY;
			srow = srow1 + info->rowskip;
		}
		else
		{
			ax1 = m_swingAxis * m_relaxationFactor * m_relaxationFactor;
			J1[srow+0] = ax1[0];
			J1[srow+1] = ax1[1];
			J1[srow+2] = ax1[2];
			J2[srow+0] = -ax1[0];
			J2[srow+1] = -ax1[1];
			J2[srow+2] = -ax1[2];
			btScalar k = info->fps * m_biasFactor;

			info->m_constraintError[srow] = k * m_swingCorrection;
			if(m_flags & BT_CONETWIST_FLAGS_ANG_CFM)
			{
				info->cfm[srow] = m_angCFM;
			}
			// m_swingCorrection is always positive or 0
			info->m_lowerLimit[srow] = 0;
			info->m_upperLimit[srow] = (m_bMotorEnabled && m_maxMotorImpulse >= 0.0f) ? m_maxMotorImpulse : SIMD_INFINITY;
			srow += info->rowskip;
		}
	}
	if(m_solveTwistLimit)
	{
		ax1 = m_twistAxis * m_relaxationFactor * m_relaxationFactor;
		btScalar *J1 = info->m_J1angularAxis;
		btScalar *J2 = info->m_J2angularAxis;
		J1[srow+0] = ax1[0];
		J1[srow+1] = ax1[1];
		J1[srow+2] = ax1[2];
		J2[srow+0] = -ax1[0];
		J2[srow+1] = -ax1[1];
		J2[srow+2] = -ax1[2];
		btScalar k = info->fps * m_biasFactor;
		info->m_constraintError[srow] = k * m_twistCorrection;
		if(m_flags & BT_CONETWIST_FLAGS_ANG_CFM)
		{
			info->cfm[srow] = m_angCFM;
		}
		if(m_twistSpan > 0.0f)
		{

			if(m_twistCorrection > 0.0f)
			{
				info->m_lowerLimit[srow] = 0;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			} 
			else
			{
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = 0;
			} 
		}
		else
		{
			info->m_lowerLimit[srow] = -SIMD_INFINITY;
			info->m_upperLimit[srow] = SIMD_INFINITY;
		}
		srow += info->rowskip;
	}
}